

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

QString * __thiscall QSslCertificate::issuerDisplayName(QSslCertificate *this)

{
  long lVar1;
  bool bVar2;
  QSslCertificate *in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QStringList names;
  QList<QString> *this_00;
  SubjectInfo in_stack_ffffffffffffff84;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x26f060);
  issuerInfo(in_RSI,in_stack_ffffffffffffff84);
  QList<QString>::operator=(this_00,in_RDI);
  QList<QString>::~QList((QList<QString> *)0x26f08d);
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x26f097);
  if (bVar2) {
    issuerInfo(in_RSI,in_stack_ffffffffffffff84);
    QList<QString>::operator=(this_00,in_RDI);
    QList<QString>::~QList((QList<QString> *)0x26f0e8);
    bVar2 = QList<QString>::isEmpty((QList<QString> *)0x26f0f2);
    if (bVar2) {
      issuerInfo(in_RSI,in_stack_ffffffffffffff84);
      QList<QString>::operator=(this_00,in_RDI);
      QList<QString>::~QList((QList<QString> *)0x26f143);
      bVar2 = QList<QString>::isEmpty((QList<QString> *)0x26f14d);
      if (bVar2) {
        QString::QString((QString *)0x26f17a);
      }
      else {
        QList<QString>::constFirst(this_00);
        QString::QString((QString *)this_00,(QString *)in_RDI);
      }
    }
    else {
      QList<QString>::constFirst(this_00);
      QString::QString((QString *)this_00,(QString *)in_RDI);
    }
  }
  else {
    QList<QString>::constFirst(this_00);
    QString::QString((QString *)this_00,(QString *)in_RDI);
  }
  QList<QString>::~QList((QList<QString> *)0x26f18c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslCertificate::issuerDisplayName() const
{
    QStringList names;
    names = issuerInfo(QSslCertificate::CommonName);
    if (!names.isEmpty())
        return names.constFirst();
    names = issuerInfo(QSslCertificate::Organization);
    if (!names.isEmpty())
        return names.constFirst();
    names = issuerInfo(QSslCertificate::OrganizationalUnitName);
    if (!names.isEmpty())
        return names.constFirst();

    return QString();
}